

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_matcher.c
# Opt level: O3

_Bool TokenMatcher_match_StepLine(TokenMatcher *token_matcher,Token *token)

{
  _Bool _Var1;
  _Bool _Var2;
  _Bool _Var3;
  _Bool _Var4;
  bool bVar5;
  
  if (token == (Token *)0x0) {
    return false;
  }
  if (token->line == (GherkinLine_conflict *)0x0) {
    _Var4 = false;
  }
  else {
    _Var1 = match_step_keywords(token,Keyword_Context,token_matcher->dialect->given_keywords);
    _Var2 = match_step_keywords(token,Keyword_Action,token_matcher->dialect->when_keywords);
    if (_Var1 && _Var2) {
      token->matched_keyword_type = Keyword_Unknown;
    }
    _Var4 = _Var1 && _Var2 || (_Var2 || _Var1);
    _Var3 = match_step_keywords(token,Keyword_Outcome,token_matcher->dialect->then_keywords);
    if ((_Var3) && (_Var4 = true, _Var1 && _Var2 || (_Var2 || _Var1))) {
      token->matched_keyword_type = Keyword_Unknown;
    }
    _Var1 = match_step_keywords(token,Keyword_Conjunction,token_matcher->dialect->and_keywords);
    _Var2 = match_step_keywords(token,Keyword_Conjunction,token_matcher->dialect->but_keywords);
    if (((_Var1) || (_Var2)) && (bVar5 = _Var4 != false, _Var4 = true, bVar5)) {
      token->matched_keyword_type = Keyword_Unknown;
    }
  }
  return _Var4;
}

Assistant:

bool TokenMatcher_match_StepLine(TokenMatcher* token_matcher, Token* token) {
    if (!token || !token->line)
        return false;
    bool final_result = false;
    bool keywords_result = match_step_keywords(token, Keyword_Context, token_matcher->dialect->given_keywords);
    if (keywords_result) {
        final_result = true;
    }
    keywords_result = match_step_keywords(token, Keyword_Action, token_matcher->dialect->when_keywords);
    if (keywords_result) {
        if (final_result) {
	    token->matched_keyword_type = Keyword_Unknown;
	}
        final_result = true;
    }
    keywords_result = match_step_keywords(token, Keyword_Outcome, token_matcher->dialect->then_keywords);
    if (keywords_result) {
        if (final_result) {
	    token->matched_keyword_type = Keyword_Unknown;
	}
        final_result = true;
    }
    bool and_result = match_step_keywords(token, Keyword_Conjunction, token_matcher->dialect->and_keywords);
    bool but_result = match_step_keywords(token, Keyword_Conjunction, token_matcher->dialect->but_keywords);
    if (and_result || but_result) {
        if (final_result) {
	    token->matched_keyword_type = Keyword_Unknown;
	}
        final_result = true;
    }
    return final_result;
}